

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall mocker::ir::BuilderContext::checkLogicalExpr(BuilderContext *this,Expression *node)

{
  pointer pBVar1;
  shared_ptr<mocker::ir::Label> local_60 [2];
  size_t local_40;
  shared_ptr<mocker::ir::Label> local_38;
  undefined1 local_28 [24];
  Expression *node_local;
  BuilderContext *this_local;
  
  if (((this->logicalExprInfo).empty & 1U) == 0) {
    local_28._16_8_ = node;
    node_local = (Expression *)this;
    ast::ASTNode::getID(&node->super_ASTNode);
    getExprAddr((BuilderContext *)local_28,(NodeID)this);
    pBVar1 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                       (&(this->logicalExprInfo).trueNext);
    local_40 = BasicBlock::getLabelID(pBVar1);
    std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)&local_38);
    pBVar1 = std::_List_iterator<mocker::ir::BasicBlock>::operator->
                       (&(this->logicalExprInfo).falseNext);
    BasicBlock::getLabelID(pBVar1);
    std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)local_60);
    emplaceInst<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
              (this,(shared_ptr<mocker::ir::Addr> *)local_28,&local_38,local_60);
    std::shared_ptr<mocker::ir::Label>::~shared_ptr(local_60);
    std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_38);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_28);
  }
  return;
}

Assistant:

void checkLogicalExpr(const ast::Expression &node) {
    if (logicalExprInfo.empty)
      return;
    emplaceInst<Branch>(
        getExprAddr(node.getID()),
        std::make_shared<Label>(logicalExprInfo.trueNext->getLabelID()),
        std::make_shared<Label>(logicalExprInfo.falseNext->getLabelID()));
  }